

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O2

JDIMENSION get_24bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  char cVar4;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  cjpeg_source_ptr pcVar13;
  size_t sVar14;
  long lVar15;
  JDIMENSION JVar16;
  code *pcVar17;
  _func_void_j_compress_ptr_cjpeg_source_ptr *__src;
  JSAMPROW __dest;
  ulong uVar18;
  bool bVar19;
  int iVar20;
  double dVar21;
  int iVar22;
  short sVar23;
  int iVar24;
  double dVar27;
  int iVar30;
  undefined1 auVar28 [16];
  double dVar31;
  undefined1 auVar29 [16];
  double dVar32;
  double dVar33;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined4 uVar25;
  undefined6 uVar26;
  
  if (sinfo[1].buffer_height == 0) {
    pcVar13 = sinfo + 2;
    sVar14 = fread(sinfo[2].start_input,1,(ulong)*(uint *)((long)&sinfo[1].input_file + 4),
                   (FILE *)sinfo->input_file);
    if (sVar14 != *(uint *)((long)&sinfo[1].input_file + 4)) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x2b;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  }
  else {
    JVar16 = *(int *)&sinfo[1].input_file - 1;
    *(JDIMENSION *)&sinfo[1].input_file = JVar16;
    pcVar13 = (cjpeg_source_ptr)
              (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,JVar16,1,0);
  }
  auVar12 = _DAT_00158c40;
  __src = pcVar13->start_input;
  __dest = *sinfo->buffer;
  JVar1 = cinfo->in_color_space;
  uVar18 = (ulong)JVar1;
  if (uVar18 == 4) {
    JVar16 = cinfo->image_width;
    pcVar17 = __src + 2;
    for (lVar15 = 0; JVar16 != (JDIMENSION)lVar15; lVar15 = lVar15 + 1) {
      dVar21 = (double)(byte)*pcVar17 / -255.0 + 1.0;
      auVar28._0_8_ = (double)(*(ushort *)(pcVar17 + -2) & 0xff);
      auVar28._8_8_ = (double)(byte)(*(ushort *)(pcVar17 + -2) >> 8);
      auVar28 = divpd(auVar28,auVar12);
      dVar27 = auVar28._0_8_ + 1.0;
      dVar31 = auVar28._8_8_ + 1.0;
      dVar32 = dVar21;
      if (dVar31 <= dVar21) {
        dVar32 = dVar31;
      }
      if (dVar27 <= dVar32) {
        dVar32 = dVar27;
      }
      if ((dVar32 != 1.0) || (NAN(dVar32))) {
        dVar33 = 1.0 - dVar32;
        dVar21 = (dVar21 - dVar32) / dVar33;
        auVar29._0_8_ = dVar27 - dVar32;
        auVar29._8_8_ = dVar31 - dVar32;
        auVar11._8_8_ = dVar33;
        auVar11._0_8_ = dVar33;
        auVar28 = divpd(auVar29,auVar11);
      }
      else {
        auVar28 = ZEXT816(0);
        dVar21 = 0.0;
      }
      iVar20 = (int)((255.0 - auVar28._0_8_ * 255.0) + 0.5);
      iVar22 = (int)((255.0 - dVar32 * 255.0) + 0.5);
      iVar24 = (int)((255.0 - dVar21 * 255.0) + 0.5);
      iVar30 = (int)((255.0 - auVar28._8_8_ * 255.0) + 0.5);
      sVar8 = (short)iVar24;
      cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar24 - (0xff < sVar8);
      sVar8 = (short)((uint)iVar24 >> 0x10);
      sVar23 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar24 >> 0x10) -
                        (0xff < sVar8),cVar4);
      sVar8 = (short)iVar30;
      cVar5 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar30 - (0xff < sVar8);
      sVar8 = (short)((uint)iVar30 >> 0x10);
      uVar25 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar30 >> 0x10) -
                        (0xff < sVar8),CONCAT12(cVar5,sVar23));
      sVar8 = (short)iVar20;
      cVar6 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar20 - (0xff < sVar8);
      sVar8 = (short)((uint)iVar20 >> 0x10);
      uVar26 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar20 >> 0x10) -
                        (0xff < sVar8),CONCAT14(cVar6,uVar25));
      sVar8 = (short)iVar22;
      cVar7 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar22 - (0xff < sVar8);
      sVar10 = (short)((uint)iVar22 >> 0x10);
      sVar8 = (short)((uint)uVar25 >> 0x10);
      sVar9 = (short)((uint6)uVar26 >> 0x20);
      sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * (char)((uint)iVar22 >> 0x10) -
                                (0xff < sVar10),CONCAT16(cVar7,uVar26)) >> 0x30);
      *(uint *)(__dest + lVar15 * 4) =
           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),
                    CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                             CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                      (0 < sVar23) * (sVar23 < 0x100) * cVar4 - (0xff < sVar23))));
      pcVar17 = pcVar17 + 3;
    }
  }
  else if (JVar1 == JCS_EXT_BGR) {
    memcpy(__dest,__src,(ulong)*(uint *)((long)&sinfo[1].input_file + 4));
  }
  else {
    iVar20 = rgb_red[uVar18];
    iVar22 = rgb_green[uVar18];
    iVar24 = rgb_blue[uVar18];
    iVar30 = rgb_pixelsize[uVar18];
    if ((JVar1 & ~JCS_YCbCr) == JCS_EXT_RGBA) {
      uVar2 = alpha_index[uVar18];
      JVar16 = cinfo->image_width;
      while (bVar19 = JVar16 != 0, JVar16 = JVar16 - 1, bVar19) {
        __dest[iVar24] = (JSAMPLE)*__src;
        __dest[iVar22] = (JSAMPLE)__src[1];
        __dest[iVar20] = (JSAMPLE)__src[2];
        __dest[uVar2] = 0xff;
        __dest = __dest + iVar30;
        __src = __src + 3;
      }
    }
    else {
      JVar16 = cinfo->image_width;
      while (bVar19 = JVar16 != 0, JVar16 = JVar16 - 1, bVar19) {
        __dest[iVar24] = (JSAMPLE)*__src;
        __dest[iVar22] = (JSAMPLE)__src[1];
        pcVar17 = __src + 2;
        __src = __src + 3;
        __dest[iVar20] = (JSAMPLE)*pcVar17;
        __dest = __dest + iVar30;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_24bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 24-bit pixels */
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  JSAMPARRAY image_ptr;
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;

  if (source->use_inversion_array) {
    /* Fetch next row from virtual array */
    source->source_row--;
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image,
       source->source_row, (JDIMENSION)1, FALSE);
    inptr = image_ptr[0];
  } else {
    if (!ReadOK(source->pub.input_file, source->iobuffer, source->row_width))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    inptr = source->iobuffer;
  }

  /* Transfer data.  Note source values are in BGR order
   * (even though Microsoft's own documents say the opposite).
   */
  outptr = source->pub.buffer[0];
  if (cinfo->in_color_space == JCS_EXT_BGR) {
    MEMCOPY(outptr, inptr, source->row_width);
  } else if (cinfo->in_color_space == JCS_CMYK) {
    for (col = cinfo->image_width; col > 0; col--) {
      JSAMPLE b = *inptr++, g = *inptr++, r = *inptr++;
      rgb_to_cmyk(r, g, b, outptr, outptr + 1, outptr + 2, outptr + 3);
      outptr += 4;
    }
  } else {
    register int rindex = rgb_red[cinfo->in_color_space];
    register int gindex = rgb_green[cinfo->in_color_space];
    register int bindex = rgb_blue[cinfo->in_color_space];
    register int aindex = alpha_index[cinfo->in_color_space];
    register int ps = rgb_pixelsize[cinfo->in_color_space];

    if (aindex >= 0) {
      for (col = cinfo->image_width; col > 0; col--) {
        outptr[bindex] = *inptr++;
        outptr[gindex] = *inptr++;
        outptr[rindex] = *inptr++;
        outptr[aindex] = 0xFF;
        outptr += ps;
      }
    } else {
      for (col = cinfo->image_width; col > 0; col--) {
        outptr[bindex] = *inptr++;
        outptr[gindex] = *inptr++;
        outptr[rindex] = *inptr++;
        outptr += ps;
      }
    }
  }

  return 1;
}